

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>_>
               *this,int i)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  
  vVar1 = FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  vVar2 = FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>
          ::val(&this->right_->fadexpr_);
  vVar3 = FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>
          ::fastAccessDx(&this->right_->fadexpr_,i);
  vVar4 = FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
          ::val(&this->left_->fadexpr_);
  return vVar4 * vVar3 + vVar2 * vVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}